

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

double __thiscall ClipperLib::Int128::AsDouble(Int128 *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  uVar2 = this->hi;
  lVar1 = this->lo;
  if (-1 < (long)uVar2) {
    if (lVar1 < 0) {
      dVar5 = 9.223372036854776e+18 - (double)lVar1;
    }
    else {
      dVar5 = (double)lVar1;
    }
    dVar4 = (double)(long)uVar2 * 1.8446744073709552e+19;
LAB_006c8b1e:
    return dVar4 + dVar5;
  }
  if (lVar1 == 0) {
    uVar2 = -uVar2;
    lVar3 = 0;
  }
  else {
    lVar3 = -lVar1;
    uVar2 = ~uVar2;
    if (0 < lVar1) {
      dVar5 = (double)lVar3 + -9.223372036854776e+18;
      dVar4 = (double)(long)uVar2 * -1.8446744073709552e+19;
      goto LAB_006c8b1e;
    }
  }
  return (double)(long)uVar2 * -1.8446744073709552e+19 - (double)lVar3;
}

Assistant:

double AsDouble() const
    {
      const double shift64 = 18446744073709551616.0; //2^64
      const double bit64 = 9223372036854775808.0;
      if (hi < 0)
      {
        Int128 tmp(*this);
        Negate(tmp);
        if (tmp.lo < 0)
          return (double)tmp.lo - bit64 - tmp.hi * shift64;
        else
          return -(double)tmp.lo - tmp.hi * shift64;
      }
      else if (lo < 0)
        return -(double)lo + bit64 + hi * shift64;
      else
        return (double)lo + (double)hi * shift64;
    }